

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O1

Matrix_Sparse * __thiscall
Disa::Matrix_Sparse::matrix_arithmetic<true>(Matrix_Sparse *this,Matrix_Sparse *other)

{
  pointer puVar1;
  pointer puVar2;
  source_location *psVar3;
  value_type vVar4;
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *pIVar5;
  matrix_type *sparse_matrix;
  pointer pvVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  unsigned_long uVar11;
  long lVar12;
  double *pdVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  value_type vVar16;
  iterator iter_this;
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> local_1f8;
  Matrix_Sparse *local_1d0;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined1 local_188 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Matrix_Sparse *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  puVar1 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar3 = (source_location *)
           (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  location = (source_location *)
             (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar10 = ((long)puVar1 - (long)puVar2 >> 3) + -1;
  if (puVar1 == puVar2) {
    lVar10 = 0;
  }
  lVar12 = ((long)psVar3 - (long)location >> 3) + -1;
  if (psVar3 == location) {
    lVar12 = 0;
  }
  local_1d0 = this;
  if ((lVar12 != lVar10) || (this->column_size != other->column_size)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_38 = &PTR_s__workspace_llm4binary_github_lic_0015eba0;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
               (Disa *)0x0,(Log_Level)&local_38,location);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_188._0_8_,local_188._8_8_);
    puVar1 = (local_1d0->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (local_1d0->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    if (puVar1 != puVar2) {
      uVar11 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_98,uVar11);
    std::operator+(&local_78,"Incompatible other dimensions, ",&local_98);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_78,",");
    local_138._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar9) {
      local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_138._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_b8,local_1d0->column_size);
    std::operator+(&local_58,&local_138,&local_b8);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_58," vs. ");
    local_118._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == paVar9) {
      local_118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_118._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    puVar1 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    if (puVar1 == puVar2) {
      uVar11 = 0;
    }
    std::__cxx11::to_string(&local_d8,uVar11);
    std::operator+(&local_160,&local_118,&local_d8);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_160,",");
    local_1a8._0_8_ = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ == paVar9) {
      local_1a8._16_8_ = paVar9->_M_allocated_capacity;
      local_1a8._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_1a8._0_8_ = (Matrix_Sparse *)(local_1a8 + 0x10);
    }
    else {
      local_1a8._16_8_ = paVar9->_M_allocated_capacity;
    }
    local_1a8._8_8_ = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_f8,other->column_size);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   &local_f8);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1c8,".");
    local_1f8.column_index = (size_type *)(pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.column_index == paVar9) {
      local_1f8.row_index = paVar9->_M_allocated_capacity;
      local_1f8.matrix = *(matrix_type **)((long)&pbVar8->field_2 + 8);
      local_1f8.column_index = &local_1f8.row_index;
    }
    else {
      local_1f8.row_index = paVar9->_M_allocated_capacity;
    }
    local_1f8.value = (pointer)pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_1f8.column_index,(long)local_1f8.value);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)local_188);
    exit(1);
  }
  Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Row
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a8,0,this);
  cVar14 = begin(other);
  pdVar13 = (double *)cVar14.matrix_row.row_index;
  sparse_matrix = cVar14.matrix_row.matrix;
  local_140 = other;
  cVar15 = end(other);
  if (SUB168((undefined1  [16])cVar14.matrix_row ^ (undefined1  [16])cVar15.matrix_row,8) != 0 ||
      SUB168((undefined1  [16])cVar14.matrix_row ^ (undefined1  [16])cVar15.matrix_row,0) != 0) {
    do {
      lVar10 = *(long *)(*(long *)local_1a8._0_8_ + local_1a8._8_8_ * 8);
      Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                (&local_1f8,(matrix_type *)local_1a8._0_8_,(size_t *)(local_1a8 + 8),
                 (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1a8._0_8_ + 0x18)
                  )->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar10,
                 (((vector<double,_std::allocator<double>_> *)(local_1a8._0_8_ + 0x30))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar10);
      uVar11 = (sparse_matrix->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pdVar13];
      local_188._0_8_ = sparse_matrix;
      local_188._8_8_ = pdVar13;
      Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1c8,
                 sparse_matrix,(size_t *)(local_188 + 8),
                 (sparse_matrix->column_index).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar11,
                 (sparse_matrix->element_value).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar11);
      while( true ) {
        uVar11 = (sparse_matrix->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pdVar13 + 1];
        local_160._M_dataplus._M_p = (pointer)sparse_matrix;
        local_160._M_string_length = (size_type)pdVar13;
        Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                  ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_188,
                   sparse_matrix,&local_160._M_string_length,
                   (sparse_matrix->column_index).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11,
                   (sparse_matrix->element_value).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11);
        if ((((local_1c8._24_8_ == local_188._24_8_) && (local_1c8._16_8_ == local_188._16_8_)) &&
            (local_1c8._0_8_ == local_188._0_8_)) && (local_1c8._8_8_ == local_188._8_8_)) break;
        lVar10 = *(long *)(*(long *)local_1a8._0_8_ + 8 + local_1a8._8_8_ * 8);
        Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                  ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_188,
                   (matrix_type *)local_1a8._0_8_,(size_t *)(local_1a8 + 8),
                   (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    (local_1a8._0_8_ + 0x18))->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar10,
                   (((vector<double,_std::allocator<double>_> *)(local_1a8._0_8_ + 0x30))->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar10);
        if (((local_1f8.matrix == (matrix_type *)local_188._24_8_) &&
            (local_1f8.row_index == local_188._16_8_)) &&
           ((local_1f8.column_index == (size_type *)local_188._0_8_ &&
            (local_1f8.value == (pointer)local_188._8_8_)))) {
LAB_00140d20:
          local_160._M_dataplus._M_p = *(pointer *)local_1c8._8_8_;
          insert((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)local_188,
                 local_1d0,(size_t *)(local_1c8 + 0x10),(size_t *)local_1c8._0_8_,
                 (double *)&local_160);
          local_1f8.row_index = local_188._16_8_;
          local_1f8.matrix = (matrix_type *)local_188._24_8_;
          local_1f8.column_index = (size_type *)local_188._0_8_;
          local_1f8.value = (pointer)local_188._8_8_;
LAB_00140dcd:
          local_1c8._0_8_ =
               &(((matrix_type *)local_1c8._0_8_)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
          local_1f8.value = local_1f8.value + 1;
          pvVar6 = (pointer)local_1c8._8_8_;
          pIVar5 = (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_1c8;
        }
        else {
          if (*(pointer *)local_1c8._0_8_ <
              (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8.column_index)->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start) goto LAB_00140d20;
          if (*(pointer *)local_1c8._0_8_ <=
              (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8.column_index)->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            *local_1f8.value = *(double *)local_1c8._8_8_ + *local_1f8.value;
            goto LAB_00140dcd;
          }
          pIVar5 = &local_1f8;
          pvVar6 = local_1f8.value;
        }
        local_1f8.column_index =
             (size_type *)
             &(((matrix_type *)local_1f8.column_index)->row_non_zero).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
        pIVar5->value = pvVar6 + 1;
      }
      local_1a8._8_8_ = local_1a8._8_8_ + 1;
      pdVar13 = (double *)((long)pdVar13 + 1);
      vVar4.row_index = (size_t)pdVar13;
      vVar4.matrix = sparse_matrix;
      vVar16 = (value_type)end(local_140);
    } while (vVar16 != vVar4);
  }
  return local_1d0;
}

Assistant:

Matrix_Sparse& Matrix_Sparse::matrix_arithmetic(const Matrix_Sparse& other) {
  ASSERT_DEBUG(size_row() == other.size_row() && size_column() == other.size_column(),
               "Incompatible other dimensions, " + std::to_string(size_row()) + "," + std::to_string(size_column()) +
               " vs. " + std::to_string(other.size_row()) + "," + std::to_string(other.size_column()) + ".");

  bool insert_state;
  iterator iter_this = begin();
  const_iterator iter_other = other.begin();
  while(iter_other != other.end()) {
    auto iter_element_this = iter_this->begin();
    const_iterator_element iter_element_other = (*iter_other).begin();
    while(iter_element_other != (*iter_other).end()) {
      if(iter_element_this == iter_this->end() || iter_element_this.i_column() > iter_element_other.i_column()) {
        std::tie(iter_element_this, insert_state) = insert(iter_element_other.i_row(), iter_element_other.i_column(),
                                                           _is_add ? (*iter_element_other) : -(*iter_element_other));
        ++iter_element_this;
        ++iter_element_other;
      } else if(iter_element_this.i_column() < iter_element_other.i_column()) {
        ++iter_element_this;
      } else {
        *iter_element_this += _is_add ? (*iter_element_other) : -(*iter_element_other);
        ++iter_element_this;
        ++iter_element_other;
      }
    }
    ++iter_this;
    ++iter_other;
  }
  return *this;
}